

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

Test * BuildTestValidationDependsOnOutput::Create(void)

{
  BuildTest *this;
  
  this = (BuildTest *)operator_new(0x460);
  BuildTest::BuildTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildTest_001f7310;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_001f7350;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildTest, ValidationDependsOnOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "build out: cat in |@ validate\n"
    "build validate: cat in2 | out\n"));

  fs_.Create("in", "");
  fs_.Create("in2", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(2u, command_runner_.commands_ran_.size());

  // Test touching "in" rebuilds "out" and "validate".
  fs_.Tick();
  fs_.Create("in", "");

  err.clear();
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(2u, command_runner_.commands_ran_.size());

  // Test touching "in2" only rebuilds "validate" ("out" doesn't depend on
  // "validate").
  fs_.Tick();
  fs_.Create("in2", "");

  err.clear();
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cat in2 > validate", command_runner_.commands_ran_[0]);
}